

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contrail.cpp
# Opt level: O2

bool XPMP2::ContrailInit(void)

{
  bool bVar1;
  int ln;
  char *szMsg;
  string path;
  
  if (ghContrailObj != 0) {
    return true;
  }
  if (ContrailInit()::bFailedAlready != '\0') {
    return false;
  }
  if (ghDrContrailLifeTime == 0) {
    ghDrContrailLifeTime =
         XPLMRegisterDataAccessor
                   ("libxplanemp/contrail/lifetime",2,0,0,0,obj_get_float,0,0,0,0,0,
                    obj_get_float_array,0,0,0,0,0);
  }
  std::__cxx11::string::string((string *)&path,(string *)&DAT_002cc678);
  std::__cxx11::string::append((char *)&path);
  std::__cxx11::string::push_back((char)&path);
  std::__cxx11::string::append((char *)&path);
  bVar1 = ExistsFile(&path);
  if (bVar1) {
    ghContrailObj = XPLMLoadObject(path._M_dataplus._M_p);
    if (ghContrailObj != 0) {
      bVar1 = true;
      if (glob < 1) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Contrail.cpp"
               ,0x111,"ContrailInit",logDEBUG,"Contrails available, have loaded %s",
               path._M_dataplus._M_p);
      }
      goto LAB_001f40a5;
    }
    if (glob < 3) {
      szMsg = "Contrails unavailable: Failed to load %s";
      ln = 0x10b;
      goto LAB_001f407f;
    }
  }
  else if (glob < 3) {
    szMsg = "Contrails unavailable: Could not find %s";
    ln = 0x100;
LAB_001f407f:
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Contrail.cpp"
           ,ln,"ContrailInit",logWARN,szMsg,path._M_dataplus._M_p);
  }
  ContrailInit()::bFailedAlready = '\x01';
  bVar1 = false;
LAB_001f40a5:
  std::__cxx11::string::~string((string *)&path);
  return bVar1;
}

Assistant:

bool ContrailInit ()
{
    static bool bFailedAlready = false;
    
    // Don't do twice
    if (ghContrailObj) return true;
    if (bFailedAlready) return false;
    
    // Register the dataRef for the contrail LifeTime
    if (!ghDrContrailLifeTime) {
        ghDrContrailLifeTime =
        XPLMRegisterDataAccessor(DR_NAME_LIFETIME,
                                 xplmType_Float, 0,
                                 nullptr, nullptr,
                                 obj_get_float, nullptr,
                                 nullptr, nullptr,
                                 nullptr, nullptr,
                                 obj_get_float_array, nullptr,
                                 nullptr, nullptr,
                                 nullptr, nullptr);
    }
    
    // path to Contrail object
    std::string path = glob.resourceDir;
    path += "Contrail";
    path += PATH_DELIM_STD;
    path += "Contrail.obj";
    if (!ExistsFile(path)) {
        LOG_MSG(logWARN, "Contrails unavailable: Could not find %s",
                path.c_str());
        bFailedAlready = true;
        return false;
    }
    
    // Load the contrail object
    // (that's _very_ small one, and we are in init phase,
    //  so we just quickly do it synchronously right here and now)
    ghContrailObj = XPLMLoadObject(path.c_str());
    if (!ghContrailObj) {
        LOG_MSG(logWARN, "Contrails unavailable: Failed to load %s",
                path.c_str());
        bFailedAlready = true;
        return false;
    }
    
    LOG_MSG(logDEBUG, "Contrails available, have loaded %s",
            path.c_str());
    
    return true;
}